

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_derived_pipeline_handle
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *state,
          Value *pipelines,ResourceTag tag,VkPipeline *out_pipeline)

{
  Value *pipelines_00;
  DatabaseInterface *resolver_00;
  bool bVar1;
  int iVar2;
  Ch *pCVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> _Var4;
  long lVar5;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var6;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  VkPipeline local_80;
  allocator_type local_71;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  Impl *local_68;
  Value *local_60;
  DatabaseInterface *local_58;
  size_type local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (tag == RESOURCE_GRAPHICS_PIPELINE) {
    lVar5 = 0x158;
  }
  else if (tag == RESOURCE_RAYTRACING_PIPELINE) {
    lVar5 = 400;
  }
  else {
    if (tag != RESOURCE_COMPUTE_PIPELINE) {
      return false;
    }
    lVar5 = 0x120;
  }
  local_60 = pipelines;
  local_58 = resolver;
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(state);
  local_80 = (VkPipeline)string_to_uint64(pCVar3);
  if ((local_80 == (VkPipeline)0x0) || (this->resolve_derivative_pipelines != true)) {
    *out_pipeline = local_80;
    return true;
  }
  p_Var6 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)((long)&(this->allocator).impl + lVar5);
  (**(code **)(*(long *)iface + 0x70))(iface);
  _Var4._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(p_Var6,(key_type *)&local_80);
  if (_Var4._M_cur != (__node_type *)0x0) {
LAB_00113f01:
    *out_pipeline =
         *(VkPipeline *)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>).
                  super__Hash_node_value_base<std::pair<const_unsigned_long,_VkPipeline_T_*>_>.
                  _M_storage._M_storage + 8);
    return true;
  }
  local_70 = p_Var6;
  local_68 = this;
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(state);
  pipelines_00 = local_60;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(local_60,pCVar3);
  resolver_00 = local_58;
  p_Var6 = local_70;
  if (bVar1) {
    if (tag == RESOURCE_RAYTRACING_PIPELINE) {
      bVar1 = parse_raytracing_pipeline(local_68,iface,local_58,pipelines_00,state);
      p_Var6 = local_70;
      if (!bVar1) {
        return false;
      }
    }
    else {
      if (tag == RESOURCE_COMPUTE_PIPELINE) {
        bVar1 = parse_compute_pipeline(local_68,iface,local_58,pipelines_00,state);
      }
      else {
        if (tag != RESOURCE_GRAPHICS_PIPELINE) {
          return false;
        }
        bVar1 = parse_graphics_pipeline(local_68,iface,local_58,pipelines_00,state);
      }
      if (bVar1 == false) {
        return false;
      }
    }
    (**(code **)(*(long *)iface + 0x70))(iface);
    _Var4._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(p_Var6,(key_type *)&local_80);
    if (_Var4._M_cur != (__node_type *)0x0) goto LAB_00113f01;
  }
  local_50 = 0;
  if ((resolver_00 == (DatabaseInterface *)0x0) ||
     (iVar2 = (*resolver_00->_vptr_DatabaseInterface[3])(resolver_00,tag,local_80,&local_50,0,0),
     (char)iVar2 == '\0')) {
    log_missing_resource("Base pipeline",(Hash)local_80);
    return false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,local_50,&local_71);
  iVar2 = (*resolver_00->_vptr_DatabaseInterface[3])
                    (resolver_00,tag,local_80,&local_50,
                     local_48._M_impl.super__Vector_impl_data._M_start,0);
  if ((char)iVar2 != '\0') {
    bVar1 = parse(local_68,iface,resolver_00,local_48._M_impl.super__Vector_impl_data._M_start,
                  (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start);
    if (!bVar1) goto LAB_001140c0;
    (**(code **)(*(long *)iface + 0x70))(iface);
    _Var4._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_70,(key_type *)&local_80);
    if (_Var4._M_cur != (__node_type *)0x0) {
      if (*(long *)((long)_Var4._M_cur + 0x10) != 0) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
        goto LAB_00113f01;
      }
      log_invalid_resource("Base pipeline",(Hash)local_80);
      goto LAB_001140c0;
    }
  }
  log_missing_resource("Base pipeline",(Hash)local_80);
LAB_001140c0:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_derived_pipeline_handle(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &state, const Value &pipelines,
                                                        ResourceTag tag, VkPipeline *out_pipeline)
{
	unordered_map<Hash, VkPipeline> *replayed_pipelines = nullptr;
	if (tag == RESOURCE_GRAPHICS_PIPELINE)
		replayed_pipelines = &replayed_graphics_pipelines;
	else if (tag == RESOURCE_COMPUTE_PIPELINE)
		replayed_pipelines = &replayed_compute_pipelines;
	else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		replayed_pipelines = &replayed_raytracing_pipelines;
	else
		return false;

	auto pipeline = string_to_uint64(state.GetString());
	if (pipeline > 0 && resolve_derivative_pipelines)
	{
		// This is pretty bad for multithreaded replay, but this should be very rare.
		iface.sync_threads();
		auto pipeline_iter = replayed_pipelines->find(pipeline);

		// If we don't have the pipeline, we might have it later in the array of graphics pipelines, queue up out of order.
		if (pipeline_iter == replayed_pipelines->end() && pipelines.HasMember(state.GetString()))
		{
			switch (tag)
			{
			case RESOURCE_GRAPHICS_PIPELINE:
				if (!parse_graphics_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_COMPUTE_PIPELINE:
				if (!parse_compute_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_RAYTRACING_PIPELINE:
				if (!parse_raytracing_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			default:
				return false;
			}

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
		}

		// Still don't have it? Look into database.
		if (pipeline_iter == replayed_pipelines->end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(tag, pipeline, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(tag, pipeline, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
			if (pipeline_iter == replayed_pipelines->end())
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}
			else if (pipeline_iter->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Base pipeline", pipeline);
				return false;
			}
		}
		*out_pipeline = pipeline_iter->second;
	}
	else
		*out_pipeline = api_object_cast<VkPipeline>(pipeline);

	return true;
}